

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O1

int IDABBDPrecGetWorkSpace(void *ida_mem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0x168;
  }
  else if (*(long *)((long)ida_mem + 0x418) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
    line = 0x170;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)ida_mem + 0x418) + 0x118);
    if (lVar1 != 0) {
      *lenrwBBDP = *(long *)(lVar1 + 0x80);
      *leniwBBDP = *(long *)(lVar1 + 0x88);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.";
    iVar2 = -5;
    error_code = -5;
    line = 0x178;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDABBDPrecGetWorkSpace",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDABBDPrecGetWorkSpace(void* ida_mem, long int* lenrwBBDP, long int* leniwBBDP)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  if (idals_mem->pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (IDALS_PMEM_NULL);
  }
  pdata = (IBBDPrecData)idals_mem->pdata;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (IDALS_SUCCESS);
}